

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiEventList.cpp
# Opt level: O0

void __thiscall smf::MidiEventList::removeEmpties(MidiEventList *this)

{
  MidiEvent *this_00;
  bool bVar1;
  size_type sVar2;
  reference __x;
  MidiEvent **item_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_> *__range1_1;
  undefined1 local_50 [8];
  vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_> newlist;
  MidiEvent **item;
  iterator __end1;
  iterator __begin1;
  vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_> *__range1;
  int count;
  MidiEventList *this_local;
  
  __range1._4_4_ = 0;
  __end1 = std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>::begin(&this->list);
  item = (MidiEvent **)
         std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>::end(&this->list);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<smf::MidiEvent_**,_std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>
                                     *)&item), bVar1) {
    newlist.super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         __gnu_cxx::
         __normal_iterator<smf::MidiEvent_**,_std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>
         ::operator*(&__end1);
    bVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       *newlist.
                        super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
    if (bVar1) {
      this_00 = *newlist.super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
      if (this_00 != (MidiEvent *)0x0) {
        MidiEvent::~MidiEvent(this_00);
        operator_delete(this_00);
      }
      *newlist.super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage = (MidiEvent *)0x0;
      __range1._4_4_ = __range1._4_4_ + 1;
    }
    __gnu_cxx::
    __normal_iterator<smf::MidiEvent_**,_std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>
    ::operator++(&__end1);
  }
  if (__range1._4_4_ != 0) {
    std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>::vector
              ((vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_> *)local_50);
    sVar2 = std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>::size(&this->list);
    std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>::reserve
              ((vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_> *)local_50,
               sVar2 - (long)__range1._4_4_);
    __end1_1 = std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>::begin(&this->list);
    item_1 = (MidiEvent **)
             std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>::end(&this->list);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1_1,
                              (__normal_iterator<smf::MidiEvent_**,_std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>
                               *)&item_1), bVar1) {
      __x = __gnu_cxx::
            __normal_iterator<smf::MidiEvent_**,_std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>
            ::operator*(&__end1_1);
      if (*__x != (MidiEvent *)0x0) {
        std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>::push_back
                  ((vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_> *)local_50,__x);
      }
      __gnu_cxx::
      __normal_iterator<smf::MidiEvent_**,_std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>
      ::operator++(&__end1_1);
    }
    std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>::swap
              (&this->list,(vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_> *)local_50);
    std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>::~vector
              ((vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_> *)local_50);
  }
  return;
}

Assistant:

void MidiEventList::removeEmpties(void) {
	int count = 0;
	for (auto& item : list) {
		if (item->empty()) {
			delete item;
			item = NULL;
			count++;
		}
	}
	if (count == 0) {
		return;
	}
	std::vector<MidiEvent*> newlist;
	newlist.reserve(list.size() - count);
	for (auto& item : list) {
		if (item) {
			newlist.push_back(item);
		}
	}
	list.swap(newlist);
}